

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int new_node(huffman_code *code)

{
  huffman_tree_node *phVar1;
  void *new_tree;
  huffman_code *code_local;
  
  phVar1 = (huffman_tree_node *)realloc(code->tree,(long)(code->numentries + 1) << 3);
  if (phVar1 == (huffman_tree_node *)0x0) {
    code_local._4_4_ = -1;
  }
  else {
    code->tree = phVar1;
    code->tree[code->numentries].branches[0] = -1;
    code->tree[code->numentries].branches[1] = -2;
    code_local._4_4_ = 1;
  }
  return code_local._4_4_;
}

Assistant:

static int
new_node(struct huffman_code *code)
{
  void *new_tree;

  new_tree = realloc(code->tree, (code->numentries + 1) * sizeof(*code->tree));
  if (new_tree == NULL)
    return (-1);
  code->tree = (struct huffman_tree_node *)new_tree;
  code->tree[code->numentries].branches[0] = -1;
  code->tree[code->numentries].branches[1] = -2;
  return 1;
}